

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

bool __thiscall string_view::operator==(string_view *this,string_view *other)

{
  __type_conflict1 _Var1;
  string this_str;
  string other_str;
  string sStack_58;
  string local_38;
  
  str_abi_cxx11_(&sStack_58,this);
  str_abi_cxx11_(&local_38,other);
  _Var1 = std::operator==(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return _Var1;
}

Assistant:

bool operator==(const string_view & other) const {
        std::string this_str = *this;
        std::string other_str = other;
        return this_str == other_str;
    }